

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Texture.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmGen12TextureCalc::ScaleTextureHeight
          (GmmGen12TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t Height)

{
  undefined1 local_38 [8];
  CCS_UNIT ScaleFactor;
  uint32_t ScaledHeight;
  uint32_t Height_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen12TextureCalc *this_local;
  
  ScaleFactor.Downscale.Height = Height;
  if ((((ulong)(pTexInfo->Flags).Gpu >> 1 & 1) != 0) &&
     (((ulong)(pTexInfo->Flags).Gpu >> 0x29 & 1) != 0)) {
    ScaleFactor.Downscale.Depth = Height;
    (*(this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
      super_GmmTextureCalc._vptr_GmmTextureCalc[0x29])(this,pTexInfo,local_38);
    ScaleFactor.Downscale.Height = (uint)ScaleFactor.Downscale.Height / ScaleFactor.Align.Depth;
  }
  return ScaleFactor.Downscale.Height;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmGen12TextureCalc::ScaleTextureHeight(GMM_TEXTURE_INFO *pTexInfo, uint32_t Height)
{
    uint32_t ScaledHeight = Height;
    if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        CCS_UNIT ScaleFactor;
        GetCCSScaleFactor(pTexInfo, ScaleFactor);

        ScaledHeight /= ScaleFactor.Downscale.Height;
    }

    return ScaledHeight;
}